

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,std::_List_const_iterator<char>,std::greater<void>>>,std::__cxx11::list<char,std::allocator<char>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,_std::_List_const_iterator<char>,_std::greater<void>_>_>
          *lhs,char *op,list<char,_std::allocator<char>_> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  toStream<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<char>,std::_List_const_iterator<char>,std::greater<void>>>>
            (&local_40,this,lhs);
  String::String(&local_58,(char *)lhs);
  doctest::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  doctest::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }